

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

Matcher<const_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_&>
* __thiscall
testing::PolymorphicMatcher::operator_cast_to_Matcher
          (Matcher<const_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_&>
           *__return_storage_ptr__,PolymorphicMatcher *this)

{
  MonomorphicImpl<const_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_&>
  *this_00;
  
  this_00 = (MonomorphicImpl<const_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_&>
             *)operator_new(0x20);
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>_>
  ::
  MonomorphicImpl<const_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_&>
  ::MonomorphicImpl(this_00,(ContainerEqMatcher<std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
                             *)this);
  Matcher<const_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_&>
  ::Matcher(__return_storage_ptr__,
            (MatcherInterface<const_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_&>
             *)this_00);
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<T>() const {
    return Matcher<T>(new MonomorphicImpl<const T&>(impl_));
  }